

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# score.c
# Opt level: O2

size_t highscore_read(high_score *scores,size_t sz)

{
  int iVar1;
  ang_file *f;
  size_t sVar2;
  size_t sVar3;
  char fname [1024];
  
  memset(scores,0,sz * 0x7e);
  path_build(fname,0x400,ANGBAND_DIR_SCORES,"scores.raw");
  safe_setuid_grab();
  f = file_open(fname,MODE_READ,FTYPE_TEXT);
  safe_setuid_drop();
  if (f == (ang_file *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar3 = 0;
    while ((sVar2 = sz, sz != sVar3 &&
           (iVar1 = file_read(f,scores->what,0x7e), sVar2 = sVar3, 0 < iVar1))) {
      sVar3 = sVar3 + 1;
      scores = scores + 1;
    }
    file_close(f);
  }
  return sVar2;
}

Assistant:

size_t highscore_read(struct high_score scores[], size_t sz)
{
	char fname[1024];
	ang_file *scorefile;
	size_t i;

	/* Wipe current scores */
	memset(scores, 0, sz * sizeof(struct high_score));

	path_build(fname, sizeof(fname), ANGBAND_DIR_SCORES, "scores.raw");
	safe_setuid_grab();
	scorefile = file_open(fname, MODE_READ, FTYPE_TEXT);
	safe_setuid_drop();

	if (!scorefile) return 0;

	for (i = 0; i < sz; i++)
		if (file_read(scorefile, (char *)&scores[i],
					  sizeof(struct high_score)) <= 0)
			break;

	file_close(scorefile);

	return i;
}